

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::SetParallelLevel
          (cmCTestMultiProcessHandler *this,optional<unsigned_long> level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  SystemInformation info;
  unsigned_long pc;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fakeProcessorCount;
  SystemInformation SStack_78;
  string local_70;
  unsigned_long local_50;
  undefined1 local_48 [32];
  bool local_28;
  
  (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  if (((undefined1  [16])
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    cmsys::SystemInformation::SystemInformation(&SStack_78);
    cmsys::SystemInformation::RunCPUCheck(&SStack_78);
    uVar3 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&SStack_78);
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING","");
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_48,&local_70);
    uVar5 = (ulong)uVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    uVar6 = uVar5;
    if (local_28 == true) {
      local_50 = 0;
      bVar2 = cmStrToULong((string *)local_48,&local_50);
      uVar6 = local_50;
      if (!bVar2) {
        std::operator+(&local_70,"Failed to parse fake processor count: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        cmSystemTools::Error(&local_70);
        uVar6 = uVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (((local_28 & 1U) != 0) &&
       (local_28 = false, (undefined1 *)local_48._0_8_ != local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    sVar4 = 2;
    if (2 < uVar6) {
      sVar4 = uVar6;
    }
    this->ParallelLevelDefault = sVar4;
    cmsys::SystemInformation::~SystemInformation(&SStack_78);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetParallelLevel(cm::optional<size_t> level)
{
  this->ParallelLevel = level;

  if (!this->ParallelLevel) {
    // '-j' was given with no value.  Limit by number of processors.
    cmsys::SystemInformation info;
    info.RunCPUCheck();
    unsigned long processorCount = info.GetNumberOfLogicalCPU();

    if (cm::optional<std::string> fakeProcessorCount =
          cmSystemTools::GetEnvVar(
            "__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING")) {
      unsigned long pc = 0;
      if (cmStrToULong(*fakeProcessorCount, &pc)) {
        processorCount = pc;
      } else {
        cmSystemTools::Error("Failed to parse fake processor count: " +
                             *fakeProcessorCount);
      }
    }

    this->ParallelLevelDefault =
      std::max(kParallelLevelMinimum, processorCount);
  }
}